

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Client::show_client_details(Client *this)

{
  size_t sVar1;
  char *pcVar2;
  string client_gender;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nClient name: ",0xe);
  sVar1 = strlen(this->name);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,this->name,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nBirthdate: ",0xc);
  sVar1 = strlen(this->bdate);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,this->bdate,sVar1);
  pcVar2 = "female";
  if (this->gender == false) {
    pcVar2 = "male";
  }
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,pcVar2,pcVar2 + (ulong)this->gender * 2 + 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nGender: ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void Client::show_client_details() {
    std::cout<<"\nClient name: "<<name;
    std::cout<<"\nBirthdate: " << bdate;
    std::string client_gender = (gender==0) ? "male": "female";
    std::cout<<"\nGender: "<<client_gender;

}